

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locator.cpp
# Opt level: O0

void __thiscall DSDcc::Locator::setIndexes(Locator *this)

{
  float fVar1;
  float fVar2;
  float lon_rem;
  float lat_rem;
  Locator *this_local;
  
  this->m_lat_index1 = (int)((this->m_lat + 90.0) / 10.0);
  this->m_lon_index1 = (int)((this->m_lon + 180.0) / 20.0);
  fVar1 = (this->m_lat + 90.0) - (float)this->m_lat_index1 * 10.0;
  fVar2 = (this->m_lon + 180.0) - (float)this->m_lon_index1 * 20.0;
  this->m_lat_index2 = (int)fVar1;
  this->m_lon_index2 = (int)(fVar2 / 2.0);
  this->m_lat_index3 = (int)((fVar1 - (float)this->m_lat_index2) * 24.0);
  this->m_lon_index3 = (int)((fVar2 - (float)(this->m_lon_index2 << 1)) * 12.0);
  return;
}

Assistant:

void Locator::setIndexes()
{
    float lat_rem, lon_rem;

    m_lat_index1 = int((m_lat + 90.0)  / 10.0);
    m_lon_index1 = int((m_lon + 180.0) / 20.0);
    lat_rem = m_lat + 90.0 - (m_lat_index1 * 10.0);
    lon_rem = m_lon + 180.0 - (m_lon_index1 * 20.0);
    m_lat_index2 = int(lat_rem);
    m_lon_index2 = int(lon_rem / 2.0);
    lat_rem = lat_rem - m_lat_index2;
    lon_rem = lon_rem - (m_lon_index2 * 2);
    m_lat_index3 = int(lat_rem * 24.0);
    m_lon_index3 = int(lon_rem * 12.0);
}